

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O2

bool __thiscall
RoboClaw::GetPinFunctions(RoboClaw *this,uint8_t *S3mode,uint8_t *S4mode,uint8_t *S5mode)

{
  ushort uVar1;
  uint uVar2;
  ssize_t sVar3;
  ssize_t sVar4;
  ssize_t sVar5;
  ssize_t sVar6;
  ssize_t sVar7;
  uint8_t *__nbytes;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  char cVar8;
  
  cVar8 = -3;
  __nbytes = S5mode;
  do {
    (*this->_vptr_RoboClaw[1])(this);
    this->m_crc = 0;
    (**this->_vptr_RoboClaw)(this,(ulong)this->m_address);
    crc_update(this,this->m_address);
    (**this->_vptr_RoboClaw)(this,0x4b);
    crc_update(this,'K');
    sVar3 = read(this,this->m_timeout,__buf,(size_t)__nbytes);
    crc_update(this,(uint8_t)sVar3);
    sVar4 = read(this,this->m_timeout,__buf_00,(size_t)__nbytes);
    crc_update(this,(uint8_t)sVar4);
    sVar5 = read(this,this->m_timeout,__buf_01,(size_t)__nbytes);
    crc_update(this,(uint8_t)sVar5);
    sVar6 = read(this,this->m_timeout,__buf_02,(size_t)__nbytes);
    sVar7 = read(this,this->m_timeout,__buf_03,(size_t)__nbytes);
    uVar2 = ((uint)sVar6 & 0xff) << 8 | (uint)sVar7 & 0xff;
    uVar1 = this->m_crc;
    __nbytes = (uint8_t *)(ulong)uVar1;
    if (uVar2 == uVar1) {
      *S3mode = (uint8_t)sVar3;
      *S4mode = (uint8_t)sVar4;
      *S5mode = (uint8_t)sVar5;
      break;
    }
    cVar8 = cVar8 + '\x01';
  } while (cVar8 != '\0');
  return uVar2 == uVar1;
}

Assistant:

bool RoboClaw::GetPinFunctions( uint8_t &S3mode, uint8_t &S4mode, uint8_t &S5mode)
{
    uint8_t crc;
    bool valid = false;
    uint8_t val1,val2,val3;
    uint8_t trys=MAXRETRY;
    int16_t data;
    do{
        flush();

        crc_clear();
        write( m_address);
        crc_update( m_address );
        write(GETPINFUNCTIONS);
        crc_update(GETPINFUNCTIONS);

        data = read( m_timeout );
        crc_update(data);
        val1=data;

        if( data != -1 )
        {
            data = read( m_timeout );
            crc_update(data);
            val2=data;
        }

        if( data != -1 )
        {
            data = read( m_timeout );
            crc_update(data);
            val3=data;
        }

        if( data != -1 )
        {
            uint16_t ccrc;
            data = read( m_timeout );
            if( data != -1 )
            {
                ccrc = data << 8;
                data = read( m_timeout );
                if( data != -1 )
                {
                    ccrc |= data;
                    if(crc_get()==ccrc)
                    {
                        S3mode = val1;
                        S4mode = val2;
                        S5mode = val3;
                        return true;
                    }
                }
            }
        }
    }while(trys--);

    return false;
}